

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmem.c
# Opt level: O0

void * luaM_malloc_(lua_State *L,size_t size,int tag)

{
  global_State *pgVar1;
  lua_State *local_38;
  void *newblock;
  global_State *g;
  int tag_local;
  size_t size_local;
  lua_State *L_local;
  
  if (size == 0) {
    L_local = (lua_State *)0x0;
  }
  else {
    pgVar1 = L->l_G;
    local_38 = (lua_State *)(*pgVar1->frealloc)(pgVar1->ud,(void *)0x0,(long)tag,size);
    if ((local_38 == (lua_State *)0x0) &&
       (local_38 = (lua_State *)tryagain(L,(void *)0x0,(long)tag,size), local_38 == (lua_State *)0x0
       )) {
      luaD_throw(L,'\x04');
    }
    pgVar1->GCdebt = pgVar1->GCdebt - size;
    L_local = local_38;
  }
  return L_local;
}

Assistant:

void *luaM_malloc_ (lua_State *L, size_t size, int tag) {
  if (size == 0)
    return NULL;  /* that's all */
  else {
    global_State *g = G(L);
    void *newblock = firsttry(g, NULL, cast_sizet(tag), size);
    if (l_unlikely(newblock == NULL)) {
      newblock = tryagain(L, NULL, cast_sizet(tag), size);
      if (newblock == NULL)
        luaM_error(L);
    }
    g->GCdebt -= cast(l_mem, size);
    return newblock;
  }
}